

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderExecUtil::TessControlExecutor::TessControlExecutor
          (TessControlExecutor *this,RenderContext *renderCtx,ShaderSpec *shaderSpec)

{
  ProgramSources *pPVar1;
  GLSLVersion version;
  GLSLVersion version_00;
  GLSLVersion version_01;
  ShaderSpec *shaderSpec_00;
  string local_220;
  ShaderSource local_200;
  string local_1d8;
  ShaderSource local_1b8;
  string local_190;
  ShaderSource local_170;
  string local_138;
  ShaderSource local_118;
  ProgramSources local_f0;
  ShaderSpec *local_20;
  ShaderSpec *shaderSpec_local;
  RenderContext *renderCtx_local;
  TessControlExecutor *this_local;
  
  local_20 = shaderSpec;
  shaderSpec_local = (ShaderSpec *)renderCtx;
  renderCtx_local = (RenderContext *)this;
  glu::ProgramSources::ProgramSources(&local_f0);
  generateVertexShaderForTess_abi_cxx11_
            (&local_138,(ShaderExecUtil *)(ulong)local_20->version,version);
  glu::VertexSource::VertexSource((VertexSource *)&local_118,&local_138);
  pPVar1 = glu::ProgramSources::operator<<(&local_f0,&local_118);
  generateTessControlShader_abi_cxx11_(&local_190,(TessControlExecutor *)local_20,shaderSpec_00);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_170,&local_190);
  pPVar1 = glu::ProgramSources::operator<<(pPVar1,&local_170);
  generateEmptyTessEvalShader_abi_cxx11_
            (&local_1d8,(ShaderExecUtil *)(ulong)local_20->version,version_00);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_1b8,&local_1d8);
  pPVar1 = glu::ProgramSources::operator<<(pPVar1,&local_1b8);
  generateEmptyFragmentSource_abi_cxx11_
            (&local_220,(ShaderExecUtil *)(ulong)local_20->version,version_01);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_200,&local_220);
  pPVar1 = glu::ProgramSources::operator<<(pPVar1,&local_200);
  BufferIoExecutor::BufferIoExecutor(&this->super_BufferIoExecutor,renderCtx,shaderSpec,pPVar1);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  glu::VertexSource::~VertexSource((VertexSource *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  glu::ProgramSources::~ProgramSources(&local_f0);
  (this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor =
       (_func_int **)&PTR__TessControlExecutor_032e6ff8;
  return;
}

Assistant:

TessControlExecutor::TessControlExecutor (const glu::RenderContext& renderCtx, const ShaderSpec& shaderSpec)
	: BufferIoExecutor	(renderCtx, shaderSpec, glu::ProgramSources()
							<< glu::VertexSource(generateVertexShaderForTess(shaderSpec.version))
							<< glu::TessellationControlSource(generateTessControlShader(shaderSpec))
							<< glu::TessellationEvaluationSource(generateEmptyTessEvalShader(shaderSpec.version))
							<< glu::FragmentSource(generateEmptyFragmentSource(shaderSpec.version)))
{
}